

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O1

timer_id_t __thiscall
so_5::timers_details::
actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::schedule(actual_thread_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
           *this,type_index *type_index,mbox_t *mbox,message_ref_t *msg,duration pause,
          duration period)

{
  atomic_refcounted_t *paVar1;
  reference_counter_type *prVar2;
  type_info *ptVar3;
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  *this_00;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_00000008;
  unique_ptr<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_std::default_delete<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>_>
  timer;
  anon_class_24_3_67f5ac77 local_80;
  timer_holder local_68;
  type_info *local_60;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  _Any_data local_50;
  code *local_40;
  
  local_80.type_index._M_target = type_index[1]._M_target;
  local_58.__r = period.__r;
  stdcpp::
  make_unique<so_5::timers_details::actual_timer_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>,timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>*>
            ((stdcpp *)&local_60,
             (timer_heap_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              **)&local_80);
  this_00 = (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
             *)type_index[1]._M_target;
  local_68.m_timer = *(timer_object<timertt::thread_safety::safe> **)(local_60 + 0x18);
  if (local_68.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    ((local_68.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i =
         ((local_68.m_timer)->m_references).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  local_80.type_index._M_target = (type_info *)mbox->m_obj;
  local_80.mbox.m_obj = (abstract_message_box_t *)msg->m_obj;
  if ((message_t *)local_80.mbox.m_obj != (message_t *)0x0) {
    LOCK();
    (((message_t *)local_80.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         (((message_t *)local_80.mbox.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  local_80.msg.m_obj = *(message_t **)pause.__r;
  if (local_80.msg.m_obj != (message_t *)0x0) {
    LOCK();
    ((local_80.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         ((local_80.msg.m_obj)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  std::function<void()>::
  function<so_5::timers_details::actual_thread_t<timertt::timer_heap_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>::schedule(std::type_index_const&,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::intrusive_ptr_t<so_5::message_t>const&,std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_,void>
            ((function<void()> *)local_50._M_pod_data,&local_80);
  timertt::details::
  basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
  ::
  activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (this_00,&local_68,local_58,in_stack_00000008,(timer_action *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_80.msg.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_80.msg.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_80.msg.m_obj != (message_t *)0x0)) {
      (*(local_80.msg.m_obj)->_vptr_message_t[1])();
    }
    local_80.msg.m_obj = (message_t *)0x0;
  }
  if ((message_t *)local_80.mbox.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_80.mbox.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       ((message_t *)local_80.mbox.m_obj != (message_t *)0x0)) {
      (*(local_80.mbox.m_obj)->_vptr_abstract_message_box_t[1])();
    }
    local_80.mbox.m_obj = (abstract_message_box_t *)0x0;
  }
  if (local_68.m_timer != (timer_object<timertt::thread_safety::safe> *)0x0) {
    LOCK();
    prVar2 = &(local_68.m_timer)->m_references;
    (prVar2->super___atomic_base<unsigned_int>)._M_i =
         (prVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((prVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
      (*(local_68.m_timer)->_vptr_timer_object[1])();
    }
    local_68.m_timer = (timer_object<timertt::thread_safety::safe> *)0x0;
  }
  local_80.type_index._M_target = local_60;
  local_60 = (type_info *)0x0;
  if (local_80.type_index._M_target != (type_info *)0x0) {
    LOCK();
    *(long *)(local_80.type_index._M_target + 8) = *(long *)(local_80.type_index._M_target + 8) + 1;
    UNLOCK();
  }
  timer_id_t::timer_id_t((timer_id_t *)this,(intrusive_ptr_t<so_5::timer_t> *)&local_80);
  if (local_80.type_index._M_target != (type_info *)0x0) {
    LOCK();
    ptVar3 = local_80.type_index._M_target + 8;
    *(long *)ptVar3 = *(long *)ptVar3 + -1;
    UNLOCK();
    if ((*(long *)ptVar3 == 0) && (local_80.type_index._M_target != (type_info *)0x0)) {
      (**(code **)(*(long *)local_80.type_index._M_target + 8))();
    }
    local_80.type_index._M_target = (type_info *)0x0;
  }
  if (local_60 != (type_info *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)this;
}

Assistant:

virtual timer_id_t
		schedule(
			const std::type_index & type_index,
			const mbox_t & mbox,
			const message_ref_t & msg,
			std::chrono::steady_clock::duration pause,
			std::chrono::steady_clock::duration period ) override
			{
				auto timer = stdcpp::make_unique< timer_demand_t >( m_thread.get() );

				m_thread->activate( timer->timer_holder(),
						pause,
						period,
						[type_index, mbox, msg]()
						{
							::so_5::rt::impl::mbox_iface_for_timers_t{ mbox }
									.deliver_message_from_timer( type_index, msg );
						} );

				return timer_id_t( timer.release() );
			}